

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementTetraCorot_10::UpdateRotation(ChElementTetraCorot_10 *this)

{
  undefined1 auVar1 [16];
  pointer psVar2;
  element_type *peVar3;
  ChMatrixNM<double,_4,_4> *pCVar4;
  int colres;
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  ChMatrixNM<double,_4,_4> P;
  ChMatrix33<double> F;
  ChMatrix33<double> S;
  undefined8 local_180 [19];
  double local_e8 [9];
  double local_a0 [18];
  
  psVar2 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  lVar5 = 0;
  do {
    *(undefined8 *)((long)local_180 + lVar5 * 4) =
         *(undefined8 *)((long)&peVar3->super_ChNodeFEAbase + lVar5 + 0x20);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  peVar3 = psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  lVar5 = 0;
  do {
    *(undefined8 *)((long)local_180 + lVar5 * 4 + 8) =
         *(undefined8 *)((long)&peVar3->super_ChNodeFEAbase + lVar5 + 0x20);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  peVar3 = psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  lVar5 = 4;
  do {
    *(undefined8 *)((long)local_180 + lVar5 * 4) =
         *(undefined8 *)((long)&peVar3->super_ChNodeFEAbase + lVar5 + 0x1c);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x1c);
  peVar3 = psVar2[3].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  lVar5 = 6;
  do {
    *(undefined8 *)((long)local_180 + lVar5 * 4) =
         *(undefined8 *)((long)&peVar3->super_ChNodeFEAbase + lVar5 + 0x1a);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x1e);
  local_180[0xc] = 0x3ff0000000000000;
  local_180[0xd] = 0x3ff0000000000000;
  local_180[0xe] = 0x3ff0000000000000;
  local_180[0xf] = 0x3ff0000000000000;
  pCVar4 = &this->mM;
  lVar5 = 0;
  do {
    lVar7 = 0;
    puVar6 = local_180;
    do {
      auVar11 = ZEXT864(0) << 0x40;
      lVar8 = 0;
      do {
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *(ulong *)((long)puVar6 + lVar8);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)((long)(pCVar4->
                                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                                        ).m_storage.m_data.array + lVar8 * 4);
        auVar1 = vfmadd231sd_fma(auVar11._0_16_,auVar12,auVar1);
        auVar11 = ZEXT1664(auVar1);
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x20);
      local_e8[lVar5 + lVar7 * 3] = auVar1._0_8_;
      lVar7 = lVar7 + 1;
      puVar6 = (undefined8 *)((long)puVar6 + 0x20);
    } while (lVar7 != 3);
    lVar5 = lVar5 + 1;
    pCVar4 = (ChMatrixNM<double,_4,_4> *)
             ((pCVar4->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>).m_storage.
              m_data.array + 1);
  } while (lVar5 != 3);
  dVar9 = PolarDecomposition::Compute
                    (local_e8,(double *)&(this->super_ChElementCorotational).A,local_a0,1e-06);
  if (dVar9 < 0.0) {
    dVar9 = *(double *)
             ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 8);
    (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         -(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    *(double *)
     ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8)
         = -dVar9;
    dVar9 = *(double *)
             ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x18);
    *(double *)
     ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
     0x10) = -*(double *)
               ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 0x10);
    *(double *)
     ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
     0x18) = -dVar9;
    dVar9 = *(double *)
             ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x28);
    *(double *)
     ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
     0x20) = -*(double *)
               ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 0x20);
    *(double *)
     ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
     0x28) = -dVar9;
    dVar9 = *(double *)
             ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x38);
    *(double *)
     ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
     0x30) = -*(double *)
               ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 0x30);
    *(double *)
     ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
     0x38) = -dVar9;
    auVar10._0_8_ =
         -*(double *)
           ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 0x40);
    auVar10._8_8_ = 0x8000000000000000;
    dVar9 = (double)vmovlpd_avx(auVar10);
    *(double *)
     ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
     0x40) = dVar9;
  }
  return;
}

Assistant:

void ChElementTetraCorot_10::UpdateRotation() {
    // P = [ p_0  p_1  p_2  p_3 ]
    //     [ 1    1    1    1   ]
    ChMatrixNM<double, 4, 4> P;
    P.block(0, 0, 3, 1) = nodes[0]->pos.eigen();
    P.block(0, 1, 3, 1) = nodes[1]->pos.eigen();
    P.block(0, 2, 3, 1) = nodes[2]->pos.eigen();
    P.block(0, 3, 3, 1) = nodes[3]->pos.eigen();
    P(3, 0) = 1.0;
    P(3, 1) = 1.0;
    P(3, 2) = 1.0;
    P(3, 3) = 1.0;

    ChMatrix33<double> F;
    // F=P*mM (only upper-left 3x3 block!)
    double sum;
    for (int colres = 0; colres < 3; ++colres)
        for (int row = 0; row < 3; ++row) {
            sum = 0;
            for (int col = 0; col < 4; ++col)
                sum += (P(row, col)) * (mM(col, colres));
            F(row, colres) = sum;
        }
    ChMatrix33<> S;
    double det = ChPolarDecomposition<>::Compute(F, this->A, S, 1E-6);
    if (det < 0)
        this->A *= -1.0;

    // GetLog() << "FEM rotation: \n" << A << "\n"
}